

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

void __thiscall SignatureData::MergeSignatureData(SignatureData *this,SignatureData *param_2)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->complete == false) {
    if (param_2->complete == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        operator=(this,param_2);
        return;
      }
    }
    else {
      uVar1 = (this->redeem_script).super_CScriptBase._size;
      uVar3 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar3 = uVar1;
      }
      if (uVar3 == 0) {
        uVar1 = (param_2->redeem_script).super_CScriptBase._size;
        uVar3 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar3 = uVar1;
        }
        if (uVar3 != 0) {
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&(this->redeem_script).super_CScriptBase,
                     &(param_2->redeem_script).super_CScriptBase);
        }
      }
      uVar1 = (this->witness_script).super_CScriptBase._size;
      uVar3 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar3 = uVar1;
      }
      if (uVar3 == 0) {
        uVar1 = (param_2->witness_script).super_CScriptBase._size;
        uVar3 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar3 = uVar1;
        }
        if (uVar3 != 0) {
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&(this->witness_script).super_CScriptBase,
                     &(param_2->witness_script).super_CScriptBase);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
        ::
        _M_insert_range_unique<std::move_iterator<std::_Rb_tree_iterator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                    *)&this->signatures,
                   (move_iterator<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    )(param_2->signatures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   (move_iterator<std::_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    )&(param_2->signatures)._M_t._M_impl.super__Rb_tree_header);
        return;
      }
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SignatureData::MergeSignatureData(SignatureData sigdata)
{
    if (complete) return;
    if (sigdata.complete) {
        *this = std::move(sigdata);
        return;
    }
    if (redeem_script.empty() && !sigdata.redeem_script.empty()) {
        redeem_script = sigdata.redeem_script;
    }
    if (witness_script.empty() && !sigdata.witness_script.empty()) {
        witness_script = sigdata.witness_script;
    }
    signatures.insert(std::make_move_iterator(sigdata.signatures.begin()), std::make_move_iterator(sigdata.signatures.end()));
}